

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

string * chaiscript::exception::eval_error::format_location<chaiscript::AST_Node>
                   (string *__return_storage_ptr__,AST_Node *t)

{
  element_type *peVar1;
  ostream *poVar2;
  ostringstream oss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"(",1);
  peVar1 = (t->location).filename.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(peVar1->_M_dataplus)._M_p,peVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(t->location).start.line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(t->location).start.column);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_location(const T &t) {
        std::ostringstream oss;
        oss << "(" << t.filename() << " " << t.start().line << ", " << t.start().column << ")";
        return oss.str();
      }